

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::UnaryFunctionLayerParams::_InternalParse
          (UnaryFunctionLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar3;
  uint32_t tag;
  float *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = (float *)ptr;
LAB_002008bb:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_48);
    if (bVar1) {
      return (char *)local_48;
    }
    local_48 = (float *)google::protobuf::internal::ReadTag((char *)local_48,&local_3c,0);
    tag_00 = local_3c;
    cVar3 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar3 == '\b') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        if (local_48 == (float *)0x0) {
          return (char *)0x0;
        }
        this->type_ = (int)uVar2;
        goto LAB_002008bb;
      }
      break;
    case 2:
      if (cVar3 == '\x15') {
        this->alpha_ = *local_48;
LAB_0020095e:
        local_48 = local_48 + 1;
        goto LAB_002008bb;
      }
      break;
    case 3:
      if (cVar3 == '\x1d') {
        this->epsilon_ = *local_48;
        goto LAB_0020095e;
      }
      break;
    case 4:
      if (cVar3 == '%') {
        this->shift_ = *local_48;
        goto LAB_0020095e;
      }
      break;
    case 5:
      if (cVar3 == '-') {
        this->scale_ = *local_48;
        goto LAB_0020095e;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      if (local_48 == (float *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return (char *)local_48;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_38);
    local_48 = (float *)google::protobuf::internal::UnknownFieldParse
                                  (tag_00,unknown,(char *)local_48,ctx);
    if (local_48 == (float *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* UnaryFunctionLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.UnaryFunctionLayerParams.Operation type = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_type(static_cast<::CoreML::Specification::UnaryFunctionLayerParams_Operation>(val));
        } else
          goto handle_unusual;
        continue;
      // float alpha = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 21)) {
          alpha_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // float epsilon = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 29)) {
          epsilon_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // float shift = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 37)) {
          shift_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // float scale = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 45)) {
          scale_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}